

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000027f940 = 0x2e2e2e2e2e2e2e;
    uRam000000000027f947._0_1_ = '.';
    uRam000000000027f947._1_1_ = '.';
    uRam000000000027f947._2_1_ = '.';
    uRam000000000027f947._3_1_ = '.';
    uRam000000000027f947._4_1_ = '.';
    uRam000000000027f947._5_1_ = '.';
    uRam000000000027f947._6_1_ = '.';
    uRam000000000027f947._7_1_ = '.';
    DAT_0027f930 = '.';
    DAT_0027f930_1._0_1_ = '.';
    DAT_0027f930_1._1_1_ = '.';
    DAT_0027f930_1._2_1_ = '.';
    DAT_0027f930_1._3_1_ = '.';
    DAT_0027f930_1._4_1_ = '.';
    DAT_0027f930_1._5_1_ = '.';
    DAT_0027f930_1._6_1_ = '.';
    uRam000000000027f938 = 0x2e2e2e2e2e2e2e;
    DAT_0027f93f = 0x2e;
    DAT_0027f920 = '.';
    DAT_0027f920_1._0_1_ = '.';
    DAT_0027f920_1._1_1_ = '.';
    DAT_0027f920_1._2_1_ = '.';
    DAT_0027f920_1._3_1_ = '.';
    DAT_0027f920_1._4_1_ = '.';
    DAT_0027f920_1._5_1_ = '.';
    DAT_0027f920_1._6_1_ = '.';
    uRam000000000027f928._0_1_ = '.';
    uRam000000000027f928._1_1_ = '.';
    uRam000000000027f928._2_1_ = '.';
    uRam000000000027f928._3_1_ = '.';
    uRam000000000027f928._4_1_ = '.';
    uRam000000000027f928._5_1_ = '.';
    uRam000000000027f928._6_1_ = '.';
    uRam000000000027f928._7_1_ = '.';
    DAT_0027f910 = '.';
    DAT_0027f910_1._0_1_ = '.';
    DAT_0027f910_1._1_1_ = '.';
    DAT_0027f910_1._2_1_ = '.';
    DAT_0027f910_1._3_1_ = '.';
    DAT_0027f910_1._4_1_ = '.';
    DAT_0027f910_1._5_1_ = '.';
    DAT_0027f910_1._6_1_ = '.';
    uRam000000000027f918._0_1_ = '.';
    uRam000000000027f918._1_1_ = '.';
    uRam000000000027f918._2_1_ = '.';
    uRam000000000027f918._3_1_ = '.';
    uRam000000000027f918._4_1_ = '.';
    uRam000000000027f918._5_1_ = '.';
    uRam000000000027f918._6_1_ = '.';
    uRam000000000027f918._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000027f908._0_1_ = '.';
    uRam000000000027f908._1_1_ = '.';
    uRam000000000027f908._2_1_ = '.';
    uRam000000000027f908._3_1_ = '.';
    uRam000000000027f908._4_1_ = '.';
    uRam000000000027f908._5_1_ = '.';
    uRam000000000027f908._6_1_ = '.';
    uRam000000000027f908._7_1_ = '.';
    DAT_0027f94f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}